

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O3

void __thiscall CEExecOptions::AddJDPar(CEExecOptions *this)

{
  double default_val;
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"j,juliandate",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"Input Julian date",&local_52);
  default_val = CEDate::CurrentJD();
  CLOptions::AddDoubleParam(&this->super_CLOptions,&local_30,&local_50,default_val);
  std::__cxx11::string::~string((string *)&local_50);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_52);
  std::__cxx11::string::~string((string *)&local_30);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_51);
  return;
}

Assistant:

inline
void CEExecOptions::AddJDPar(void)
{
    AddDoubleParam("j,juliandate", "Input Julian date", CEDate::CurrentJD());
}